

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::ImFont(ImFont *this)

{
  ImVec2 local_24 [2];
  ImFont *local_10;
  ImFont *this_local;
  
  local_10 = this;
  ImVector<float>::ImVector(&this->IndexAdvanceX);
  ImVector<unsigned_short>::ImVector(&this->IndexLookup);
  ImVector<ImFontGlyph>::ImVector(&this->Glyphs);
  ImVec2::ImVec2(&this->DisplayOffset);
  this->FontSize = 0.0;
  this->FallbackAdvanceX = 0.0;
  this->FallbackChar = 0x3f;
  ImVec2::ImVec2(local_24,0.0,0.0);
  this->DisplayOffset = local_24[0];
  this->FallbackGlyph = (ImFontGlyph *)0x0;
  this->ContainerAtlas = (ImFontAtlas *)0x0;
  this->ConfigData = (ImFontConfig *)0x0;
  this->ConfigDataCount = 0;
  this->DirtyLookupTables = false;
  this->Scale = 1.0;
  this->Descent = 0.0;
  this->Ascent = 0.0;
  this->MetricsTotalSurface = 0;
  return;
}

Assistant:

ImFont::ImFont()
{
    FontSize = 0.0f;
    FallbackAdvanceX = 0.0f;
    FallbackChar = (ImWchar)'?';
    DisplayOffset = ImVec2(0.0f, 0.0f);
    FallbackGlyph = NULL;
    ContainerAtlas = NULL;
    ConfigData = NULL;
    ConfigDataCount = 0;
    DirtyLookupTables = false;
    Scale = 1.0f;
    Ascent = Descent = 0.0f;
    MetricsTotalSurface = 0;
}